

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::eval_leftShiftVecScalar_uvec2(ShaderEvalContext *c)

{
  float *pfVar1;
  VecAccess<float,_4,_2> local_40;
  undefined1 local_30 [16];
  _anonymous_namespace_ local_20 [8];
  Vector<float,_2> local_18;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_30,(int)c + 0x30,3);
  tcu::Vector<float,_2>::asUint((Vector<float,_2> *)(local_30 + 8));
  pfVar1 = tcu::Vector<float,_4>::x(local_10->in + 1);
  sr::(anonymous_namespace)::leftShiftVecScalar<unsigned_int,2>
            (local_20,(Vector<unsigned_int,_2> *)(local_30 + 8),(int)*pfVar1);
  tcu::Vector<unsigned_int,_2>::asFloat((Vector<unsigned_int,_2> *)&local_18);
  local_40 = tcu::Vector<float,_4>::yz(&local_10->color);
  tcu::VecAccess<float,_4,_2>::operator=(&local_40,&local_18);
  return;
}

Assistant:

void eval_selection_uint	(ShaderEvalContext& c) { c.color.x()	= (float)selection(c.in[0].z() > 0.0f,	(deUint32)c.in[1].x(),					(deUint32)c.in[2].y()); }